

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O2

ulong parse_arg(int argc,char **argv)

{
  unsigned_long uVar1;
  runtime_error *this;
  allocator local_31;
  string local_30;
  
  if (1 < argc) {
    std::__cxx11::string::string((string *)&local_30,argv[1],&local_31);
    uVar1 = std::__cxx11::stoul(&local_30,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_30);
    return uVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Incorrect input");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ulong parse_arg(int argc, char *argv[]){
  ulong res;
  if(argc  < 2)
    throw std::runtime_error("Incorrect input");
  try{
    res = std::stoul(argv[1]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  return res;
}